

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::RecreateBufferDataStoreCase::iterate(RecreateBufferDataStoreCase *this)

{
  int iVar1;
  int iVar2;
  GLenum target;
  bool bVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  uint uVar6;
  char *str;
  pointer pDVar7;
  deUint8 *pdVar8;
  size_t in_R9;
  iterator iStack_60;
  bool iterOk;
  __normal_iterator<deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
  local_58;
  __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
  local_50;
  const_iterator spec;
  deUint32 buf;
  undefined1 local_38 [8];
  ReferenceBuffer refBuf;
  BufferVerifier verifier;
  deUint32 baseSeed;
  RecreateBufferDataStoreCase *this_local;
  
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  BufferTestUtil::BufferVerifier::BufferVerifier
            ((BufferVerifier *)
             &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_BufferCase).super_TestCase.m_context,this->m_verify);
  BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)local_38);
  spec._M_current._0_4_ = BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  local_58._M_current =
       (DataStoreSpec *)
       std::
       vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
       ::begin(&this->m_specs);
  __gnu_cxx::
  __normal_iterator<deqp::gles2::Functional::DataStoreSpec_const*,std::vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>>
  ::__normal_iterator<deqp::gles2::Functional::DataStoreSpec*>
            ((__normal_iterator<deqp::gles2::Functional::DataStoreSpec_const*,std::vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>>
              *)&local_50,&local_58);
  do {
    iStack_60 = std::
                vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                ::end(&this->m_specs);
    bVar3 = __gnu_cxx::operator!=(&local_50,&stack0xffffffffffffffa0);
    if (!bVar3) {
LAB_019e1d52:
      BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,(deUint32)spec._M_current);
      BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)local_38);
      BufferTestUtil::BufferVerifier::~BufferVerifier
                ((BufferVerifier *)
                 &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return STOP;
    }
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)local_38,pDVar7->size);
    pdVar8 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    iVar1 = pDVar7->size;
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    iVar2 = pDVar7->size;
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    dVar5 = pDVar7->target;
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    dVar5 = ::deInt32Hash(iVar2 + dVar5 + pDVar7->usage);
    BufferTestUtil::fillWithRandomBytes(pdVar8,iVar1,dVar4 ^ 0xbeef ^ dVar5);
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BufferCase).super_CallLogWrapper,pDVar7->target,
               (deUint32)spec._M_current);
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    target = pDVar7->target;
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    iVar1 = pDVar7->size;
    pdVar8 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferCase).super_CallLogWrapper,target,(long)iVar1,pdVar8,
               pDVar7->usage);
    BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
    uVar6 = (deUint32)spec._M_current;
    pdVar8 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pDVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
             ::operator->(&local_50);
    uVar6 = BufferTestUtil::BufferVerifier::verify
                      ((BufferVerifier *)
                       &refBuf.m_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)uVar6,
                       pdVar8,0,(uchar *)(ulong)(uint)pDVar7->size,in_R9);
    if ((uVar6 & 1) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
      goto LAB_019e1d52;
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
    ::operator++(&local_50,0);
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			baseSeed	= deStringHash(getName()) ^ 0xbeef;
		BufferVerifier			verifier	(m_context, m_verify);
		ReferenceBuffer			refBuf;
		const deUint32			buf			= genBuffer();

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		for (vector<DataStoreSpec>::const_iterator spec = m_specs.begin(); spec != m_specs.end(); spec++)
		{
			bool iterOk = false;

			refBuf.setSize(spec->size);
			fillWithRandomBytes(refBuf.getPtr(), spec->size, baseSeed ^ deInt32Hash(spec->size+spec->target+spec->usage));

			glBindBuffer(spec->target, buf);
			glBufferData(spec->target, spec->size, refBuf.getPtr(), spec->usage);

			checkError();

			iterOk = verifier.verify(buf, refBuf.getPtr(), 0, spec->size);

			if (!iterOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				break;
			}
		}

		deleteBuffer(buf);
		return STOP;
	}